

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBinaryReader::ReadTableSection(WasmBinaryReader *this,bool isImportSection)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  uint32 maxInitial;
  undefined7 in_register_00000031;
  WasmBinaryReader *pWVar6;
  FunctionBody *pFVar7;
  SectionLimits local_30;
  uint32 local_24 [2];
  uint32 length;
  
  uVar4 = 1;
  pWVar6 = this;
  if ((int)CONCAT71(in_register_00000031,isImportSection) == 0) {
    uVar4 = LEB128<unsigned_int,32u>(this,local_24);
  }
  if (uVar4 < 2) {
    if (uVar4 == 1) {
      pWVar6 = this;
      cVar2 = LEB128<char,7u>(this,local_24);
      if (cVar2 != -0x10) {
        ThrowDecodingError(pWVar6,L"Only anyfunc type is supported. Unknown type %d",
                           (ulong)(uint)(int)cVar2);
      }
      maxInitial = 0xffffffff;
      if (DAT_015aa2e2 == '\0') {
        maxInitial = DAT_015aa2e8;
      }
      local_30 = (SectionLimits)
                 ReadSectionLimitsBase<Wasm::TableSectionLimits>
                           (this,maxInitial,maxInitial,L"table too big");
      Js::WebAssemblyModule::InitializeTable(this->m_module,(TableSectionLimits *)&local_30);
      pFVar7 = (this->m_funcState).body;
      if (pFVar7 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmReaderPhase);
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
        if (this->m_readerState == READER_STATE_FUNCTION) {
          pFVar7 = (this->m_funcState).body;
        }
        else {
          pFVar7 = (FunctionBody *)0x0;
        }
        if ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        bVar3 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,WasmReaderPhase,sourceContextId,
                           ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                           ptr)->functionId);
      }
      if (bVar3 != false) {
        Output::Print(L"Indirect table: %u to %u entries",(ulong)local_30.initial,
                      (ulong)local_30.maximum);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    return;
  }
  ThrowDecodingError(pWVar6,L"Maximum of one table allowed");
}

Assistant:

void WasmBinaryReader::ReadTableSection(bool isImportSection)
{
    uint32 length;
    uint32 entries;
    if (isImportSection)
    {
        entries = 1;
    }
    else
    {
        entries = LEB128(length);
    }
    if (entries > 1)
    {
        ThrowDecodingError(_u("Maximum of one table allowed"));
    }

    if (entries == 1)
    {
        int8 elementType = SLEB128<int8, 7>(length);
        if (elementType != LanguageTypes::anyfunc)
        {
            ThrowDecodingError(_u("Only anyfunc type is supported. Unknown type %d"), elementType);
        }
        TableSectionLimits limits = ReadSectionLimitsBase<TableSectionLimits>(Limits::GetMaxTableSize(), Limits::GetMaxTableSize(), _u("table too big"));
        m_module->InitializeTable(&limits);
        TRACE_WASM_DECODER(_u("Indirect table: %u to %u entries"), limits.initial, limits.maximum);
    }
}